

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brkiter.cpp
# Opt level: O1

int32_t __thiscall
icu_63::BreakIterator::getRuleStatusVec
          (BreakIterator *this,int32_t *fillInVec,int32_t capacity,UErrorCode *status)

{
  if (U_ZERO_ERROR < *status) {
    return 0;
  }
  if (capacity < 1) {
    *status = U_BUFFER_OVERFLOW_ERROR;
  }
  else {
    *fillInVec = 0;
  }
  return 1;
}

Assistant:

int32_t BreakIterator::getRuleStatusVec(int32_t *fillInVec, int32_t capacity, UErrorCode &status) {
    if (U_FAILURE(status)) {
        return 0;
    }
    if (capacity < 1) {
        status = U_BUFFER_OVERFLOW_ERROR;
        return 1;
    }
    *fillInVec = 0;
    return 1;
}